

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O3

void sylvan_quit(void)

{
  quit_cb *pp_Var1;
  gc_hook_entry *pgVar2;
  gc_hook_entry_t pgVar3;
  gc_hook_entry_t __ptr;
  reg_quit_entry *__ptr_00;
  reg_quit_entry *e;
  
  while (__ptr_00 = quit_register, quit_register != (reg_quit_entry *)0x0) {
    pp_Var1 = &quit_register->cb;
    quit_register = quit_register->next;
    (**pp_Var1)();
    free(__ptr_00);
  }
  quit_register = (reg_quit_entry *)0x0;
  pgVar3 = pregc_list;
  while (__ptr = postgc_list, pgVar3 != (gc_hook_entry_t)0x0) {
    pgVar2 = pgVar3->next;
    pregc_list = pgVar2;
    free(pgVar3);
    pgVar3 = pgVar2;
  }
  while (pgVar3 = mark_list, __ptr != (gc_hook_entry_t)0x0) {
    pgVar2 = __ptr->next;
    postgc_list = pgVar2;
    free(__ptr);
    __ptr = pgVar2;
  }
  while (pgVar3 != (gc_hook_entry_t)0x0) {
    pgVar2 = pgVar3->next;
    mark_list = pgVar2;
    free(pgVar3);
    pgVar3 = pgVar2;
  }
  cache_free();
  llmsset_free(nodes);
  return;
}

Assistant:

void
sylvan_quit()
{
    while (quit_register != NULL) {
        struct reg_quit_entry *e = quit_register;
        quit_register = e->next;
        e->cb();
        free(e);
    }

    while (pregc_list != NULL) {
        gc_hook_entry_t e = pregc_list;
        pregc_list = e->next;
        free(e);
    }

    while (postgc_list != NULL) {
        gc_hook_entry_t e = postgc_list;
        postgc_list = e->next;
        free(e);
    }

    while (mark_list != NULL) {
        gc_hook_entry_t e = mark_list;
        mark_list = e->next;
        free(e);
    }

    cache_free();
    llmsset_free(nodes);
}